

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O2

void __thiscall Gc_SpawnMaxPlus1_Test::Gc_SpawnMaxPlus1_Test(Gc_SpawnMaxPlus1_Test *this)

{
  anon_unknown.dwarf_4c53f::Gc::Gc(&this->super_Gc);
  (this->super_Gc).super_Test._vptr_Test = (_func_int **)&PTR__Test_00189ea0;
  return;
}

Assistant:

TEST_F (Gc, SpawnMaxPlus1) {
    test_watch_thread gc;

    auto const sp = expect_spawn_calls (gc, pstore::broker::gc_watch_thread::max_gc_processes);
    std::thread thread{[&gc] () { gc.watcher (); }};
    for (auto const & c : sp) {
        gc.start_vacuum (std::get<std::string> (c));
    }
    gc.start_vacuum ("one-extra-call");
    gc.stop ();
    thread.join ();
}